

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O2

bool spdlog::details::os::is_color_terminal(void)

{
  undefined1 uVar1;
  int iVar2;
  char *env_p;
  char *local_8;
  
  local_8 = getenv("TERM");
  if (local_8 == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = is_color_terminal::result;
    if ((is_color_terminal()::result == '\0') &&
       (iVar2 = __cxa_guard_acquire(&is_color_terminal()::result), uVar1 = is_color_terminal::result
       , iVar2 != 0)) {
      is_color_terminal::result =
           std::
           any_of<char_const*const*,spdlog::details::os::is_color_terminal()::_lambda(char_const*)_1_>
                     (is_color_terminal::Terms,
                      (char **)&std::
                                _Sp_counted_ptr_inplace<spdlog::sinks::rotating_file_sink<std::mutex>,std::allocator<spdlog::sinks::rotating_file_sink<std::mutex>>,(__gnu_cxx::_Lock_policy)2>
                                ::vtable,(anon_class_8_1_a7dcfcbe_for__M_pred)&local_8);
      __cxa_guard_release(&is_color_terminal()::result);
      uVar1 = is_color_terminal::result;
    }
  }
  return (bool)uVar1;
}

Assistant:

inline bool is_color_terminal() SPDLOG_NOEXCEPT
{
#ifdef _WIN32
    return true;
#else
    static constexpr const char *Terms[] = {
        "ansi", "color", "console", "cygwin", "gnome", "konsole", "kterm", "linux", "msys", "putty", "rxvt", "screen", "vt100", "xterm"};

    const char *env_p = std::getenv("TERM");
    if (env_p == nullptr)
    {
        return false;
    }

    static const bool result =
        std::any_of(std::begin(Terms), std::end(Terms), [&](const char *term) { return std::strstr(env_p, term) != nullptr; });
    return result;
#endif
}